

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressBlock
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  
  uVar1 = (cctx->appliedParams).maxBlockSize;
  uVar3 = 1L << ((byte)(cctx->appliedParams).cParams.windowLog & 0x3f);
  if (uVar1 < uVar3) {
    uVar3 = uVar1;
  }
  if (uVar3 < srcSize) {
    return 0xffffffffffffffb8;
  }
  sVar2 = ZSTD_compressContinue_internal(cctx,dst,dstCapacity,src,srcSize,0,0);
  return sVar2;
}

Assistant:

size_t ZSTD_compressBlock(ZSTD_CCtx* cctx, void* dst, size_t dstCapacity, const void* src, size_t srcSize)
{
    return ZSTD_compressBlock_deprecated(cctx, dst, dstCapacity, src, srcSize);
}